

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWatermarkLabel::setSideWidget(QWatermarkLabel *this,QWidget *widget)

{
  QWidget *in_RSI;
  QLayout *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget_00;
  QBoxLayout *this_00;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QWidget *)in_RDI[1].super_QLayoutItem._vptr_QLayoutItem != in_RSI) {
    if (in_RDI[1].super_QLayoutItem._vptr_QLayoutItem != (_func_int **)0x0) {
      QLayout::removeWidget(in_RDI,in_RSI);
      QWidget::hide((QWidget *)0x7c1256);
    }
    in_RDI[1].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)in_RSI;
    if (in_RDI[1].super_QLayoutItem._vptr_QLayoutItem != (_func_int **)0x0) {
      widget_00 = *(QWidget **)&in_RDI[1].field_0x8;
      this_00 = (QBoxLayout *)in_RDI[1].super_QLayoutItem._vptr_QLayoutItem;
      memset(local_c,0,4);
      alignment.i = (Int)((ulong)in_RDI >> 0x20);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7c129c);
      QBoxLayout::addWidget(this_00,widget_00,0,(Alignment)alignment.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setSideWidget(QWidget *widget) {
        if (m_sideWidget == widget)
            return;
        if (m_sideWidget) {
            m_layout->removeWidget(m_sideWidget);
            m_sideWidget->hide();
        }
        m_sideWidget = widget;
        if (m_sideWidget)
            m_layout->addWidget(m_sideWidget);
    }